

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<long,char_const(&)[3]>
          (String *__return_storage_ptr__,kj *this,long *params,char (*params_1) [3])

{
  undefined1 local_50 [56];
  
  _::Stringifier::operator*
            ((CappedArray<char,_26UL> *)(local_50 + 0x10),(Stringifier *)&_::STR,*(long *)this);
  local_50._8_8_ = strlen((char *)params);
  local_50._0_8_ = params;
  _::concat<kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)(local_50 + 0x10),(CappedArray<char,_26UL> *)local_50,
             (ArrayPtr<const_char> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}